

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::maybe::scan(maybe *this,location *loc)

{
  bool bVar1;
  region *in_RDI;
  region reg;
  location first;
  location *in_stack_ffffffffffffff08;
  region *this_00;
  location *in_stack_ffffffffffffff28;
  location *in_stack_ffffffffffffff30;
  location *in_stack_ffffffffffffff38;
  region *in_stack_ffffffffffffff40;
  
  this_00 = in_RDI;
  location::location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  scanner_storage::scan((scanner_storage *)this_00,(location *)in_RDI);
  bVar1 = region::is_ok((region *)0x1f7e75);
  if (!bVar1) {
    location::operator=((location *)in_RDI,in_stack_ffffffffffffff08);
  }
  region::region(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  region::~region(in_RDI);
  location::~location((location *)in_RDI);
  return this_00;
}

Assistant:

TOML11_INLINE region maybe::scan(location& loc) const
{
    const auto first = loc;
    const auto reg = other_.scan(loc);
    if( ! reg.is_ok())
    {
        loc = first;
    }
    return region(first, loc);
}